

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

QObjectList * __thiscall
QObjectPrivate::receiverList(QObjectList *__return_storage_ptr__,QObjectPrivate *this,char *signal)

{
  __pointer_type pCVar1;
  uint uVar2;
  __pointer_type pSVar3;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QObject **)0x0;
  (__return_storage_ptr__->d).size = 0;
  uVar2 = signalIndex(this,signal,(QMetaObject **)0x0);
  pCVar1 = (this->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>._q_value.
           _M_b._M_p;
  if (((-1 < (int)uVar2 && pCVar1 != (__pointer_type)0x0) &&
      ((pCVar1->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b.
       _M_p != (__pointer_type)0x0)) &&
     ((int)uVar2 <
      (int)((pCVar1->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value.
            _M_b._M_p)->allocated)) {
    pSVar3 = (pCVar1->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value
             ._M_b._M_p + (ulong)uVar2 + 1;
    while (pSVar3 = *(__pointer_type *)&pSVar3[1].super_ConnectionOrSignalVector,
          pSVar3 != (__pointer_type)0x0) {
      if (*(parameter_type *)((long)(pSVar3 + 2) + 8) != (parameter_type)0x0) {
        QList<QObject_*>::append(__return_storage_ptr__,*(parameter_type *)((long)(pSVar3 + 2) + 8))
        ;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QObjectList QObjectPrivate::receiverList(const char *signal) const
{
    QObjectList returnValue;
    int signal_index = signalIndex(signal);
    ConnectionData *cd = connections.loadAcquire();
    if (signal_index < 0 || !cd)
        return returnValue;
    if (signal_index < cd->signalVectorCount()) {
        const QObjectPrivate::Connection *c = cd->signalVector.loadRelaxed()->at(signal_index).first.loadRelaxed();

        while (c) {
            QObject *r = c->receiver.loadRelaxed();
            if (r)
                returnValue << r;
            c = c->nextConnectionList.loadRelaxed();
        }
    }
    return returnValue;
}